

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonBlobEdit(JsonParse *pParse,u32 iDel,u32 nDel,u8 *aIns,u32 nIns)

{
  long lVar1;
  JsonParse *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  uint in_R8D;
  i64 d;
  
  lVar1 = (ulong)in_R8D - (ulong)in_EDX;
  if (lVar1 != 0) {
    if (((long)(ulong)*(uint *)((long)in_RDI + 0xc) < (long)((ulong)*(uint *)(in_RDI + 1) + lVar1))
       && (jsonBlobExpand(in_RCX,in_R8D), *(char *)((long)in_RDI + 0x2f) != '\0')) {
      return;
    }
    memmove((void *)(*in_RDI + (ulong)(in_ESI + in_R8D)),
            (void *)(*in_RDI + (ulong)(in_ESI + in_EDX)),(ulong)((int)in_RDI[1] - (in_ESI + in_EDX))
           );
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + (int)lVar1;
    *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + (int)lVar1;
  }
  if ((in_R8D != 0) && (in_RCX != (JsonParse *)0x0)) {
    memcpy((void *)(*in_RDI + (ulong)in_ESI),in_RCX,(ulong)in_R8D);
  }
  return;
}

Assistant:

static void jsonBlobEdit(
  JsonParse *pParse,     /* The JSONB to be modified is in pParse->aBlob */
  u32 iDel,              /* First byte to be removed */
  u32 nDel,              /* Number of bytes to remove */
  const u8 *aIns,        /* Content to insert */
  u32 nIns               /* Bytes of content to insert */
){
  i64 d = (i64)nIns - (i64)nDel;
  if( d!=0 ){
    if( pParse->nBlob + d > pParse->nBlobAlloc ){
      jsonBlobExpand(pParse, pParse->nBlob+d);
      if( pParse->oom ) return;
    }
    memmove(&pParse->aBlob[iDel+nIns],
            &pParse->aBlob[iDel+nDel],
            pParse->nBlob - (iDel+nDel));
    pParse->nBlob += d;
    pParse->delta += d;
  }
  if( nIns && aIns ) memcpy(&pParse->aBlob[iDel], aIns, nIns);
}